

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

bool __thiscall JSON::forEachArrayItem(JSON *this,function<void_(JSON)> *fn)

{
  element_type *peVar1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  JSON local_40;
  
  peVar1 = (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (_Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
      super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
           (peVar1->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t,
     (_Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>)
     _Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
     super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl == (JSON_value *)0x0)) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(_Var2._M_t.
                           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                           .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                           &JSON_value::typeinfo,&JSON_array::typeinfo,0);
  }
  if (lVar4 != 0) {
    puVar5 = *(undefined8 **)(lVar4 + 0x10);
    puVar3 = *(undefined8 **)(lVar4 + 0x18);
    if (puVar5 != puVar3) {
      do {
        local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*puVar5;
        local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar5[1];
        if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*fn->_M_invoker)((_Any_data *)fn,&local_40);
        if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        puVar5 = puVar5 + 2;
      } while (puVar5 != puVar3);
    }
  }
  return lVar4 != 0;
}

Assistant:

bool
JSON::forEachArrayItem(std::function<void(JSON value)> fn) const
{
    if (auto v = m ? dynamic_cast<JSON_array const*>(m->value.get()) : nullptr) {
        for (auto const& i: v->elements) {
            fn(JSON(i));
        }
        return true;
    }
    return false;
}